

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O3

bool QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::SafeAreaMarginsChangedEvent,QWindow*>(QWindow *args)

{
  long *plVar1;
  WindowSystemEvent *e;
  _func_int **pp_Var2;
  
  e = (WindowSystemEvent *)operator_new(0x28);
  e->type = SafeAreaMarginsChanged;
  e->flags = 0;
  e->eventAccepted = true;
  e->_vptr_WindowSystemEvent = (_func_int **)&PTR__SafeAreaMarginsChangedEvent_007d8e48;
  if (args == (QWindow *)0x0) {
    pp_Var2 = (_func_int **)0x0;
  }
  else {
    pp_Var2 = (_func_int **)QtSharedPointer::ExternalRefCountData::getAndRef(&args->super_QObject);
  }
  e[1]._vptr_WindowSystemEvent = pp_Var2;
  *(QWindow **)&e[1].type = args;
  QWindowSystemInterfacePrivate::WindowSystemEventList::append
            (&QWindowSystemInterfacePrivate::windowSystemEventQueue,e);
  if ((QCoreApplication::self != 0) &&
     (plVar1 = *(long **)(*(long *)(*(long *)(QCoreApplication::self + 8) + 0x58) + 0x60),
     plVar1 != (long *)0x0)) {
    (**(code **)(*plVar1 + 0xa0))();
  }
  return true;
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent(Args ...args)
{
    QWindowSystemInterfacePrivate::windowSystemEventQueue.append(new EventType(args...));
    if (QAbstractEventDispatcher *dispatcher = QGuiApplicationPrivate::qt_qpa_core_dispatcher())
        dispatcher->wakeUp();
    return true;
}